

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall
icu_63::BasicCalendarFactory::updateVisibleIDs
          (BasicCalendarFactory *this,Hashtable *result,UErrorCode *status)

{
  long lVar1;
  ConstChar16Ptr local_d0;
  Hashtable *local_c8;
  char16_t *local_c0;
  UnicodeString local_b0;
  UnicodeString id;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_c8 = result;
    for (lVar1 = 0; lVar1 != 0x90; lVar1 = lVar1 + 8) {
      UnicodeString::UnicodeString(&id,L'@');
      local_d0.p_ = L"calendar=";
      UnicodeString::UnicodeString(&local_b0,'\x01',&local_d0,-1);
      UnicodeString::append(&id,&local_b0);
      UnicodeString::~UnicodeString(&local_b0);
      local_c0 = local_d0.p_;
      UnicodeString::UnicodeString(&local_b0,*(char **)((long)gCalTypes + lVar1),-1,kInvariant);
      UnicodeString::append(&id,&local_b0);
      UnicodeString::~UnicodeString(&local_b0);
      Hashtable::put(local_c8,&id,this,status);
      UnicodeString::~UnicodeString(&id);
    }
  }
  return;
}

Assistant:

virtual void updateVisibleIDs(Hashtable& result, UErrorCode& status) const
    {
        if (U_SUCCESS(status)) {
            for(int32_t i=0;gCalTypes[i] != NULL;i++) {
                UnicodeString id((UChar)0x40); /* '@' a variant character */
                id.append(UNICODE_STRING_SIMPLE("calendar="));
                id.append(UnicodeString(gCalTypes[i], -1, US_INV));
                result.put(id, (void*)this, status);
            }
        }
    }